

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<short> *a)

{
  bool bVar1;
  int count;
  uint local_1c;
  
  if (a->m_a != (short *)0x0) {
    memset(a->m_a,0,(long)a->m_capacity * 2);
  }
  a->m_count = 0;
  local_1c = 0;
  bVar1 = ReadInt(this,(ON__INT32 *)&local_1c);
  if (0 < (int)local_1c && bVar1) {
    ON_SimpleArray<short>::SetCapacity(a,(ulong)local_1c);
    bVar1 = ReadInt16(this,(long)(int)local_1c,a->m_a);
    if (bVar1) {
      bVar1 = true;
      if ((-1 < (int)local_1c) && ((int)local_1c <= a->m_capacity)) {
        a->m_count = local_1c;
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadArray( ON_SimpleArray<ON__INT16>& a )
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) {
    a.SetCapacity( count );
    rc = ReadShort( count, a.Array() );
    if ( rc )
      a.SetCount(count);
  }
  return rc;
}